

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Version::SharedCtor(Version *this,Arena *arena)

{
  Arena *arena_local;
  Version *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x10),0,0xc);
  return;
}

Assistant:

inline void Version::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, major_),
           0,
           offsetof(Impl_, patch_) -
               offsetof(Impl_, major_) +
               sizeof(Impl_::patch_));
}